

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OstreamBuffer.cpp
# Opt level: O2

ssize_t __thiscall
binlog::detail::OstreamBuffer::write(OstreamBuffer *this,int __fd,void *__buf,size_t __n)

{
  void *in_RAX;
  undefined4 in_register_00000034;
  void *n;
  void *__src;
  
  __src = (void *)CONCAT44(in_register_00000034,__fd);
  for (; __buf != (void *)0x0; __buf = (void *)((long)__buf - (long)n)) {
    n = (void *)0x400;
    if (__buf < (void *)0x400) {
      n = __buf;
    }
    reserve(this,(size_t)n);
    in_RAX = memcpy(this->_p,__src,(size_t)n);
    this->_p = this->_p + (long)n;
    __src = (void *)((long)__src + (long)n);
  }
  return (ssize_t)in_RAX;
}

Assistant:

void OstreamBuffer::write(const char* buf, std::size_t size)
{
  while (size != 0)
  {
    const std::size_t wsize = (std::min)(size, _buf.size());
    reserve(wsize);
    memcpy(_p, buf, wsize);
    _p += wsize;
    size -= wsize;
    buf += wsize;
  }
}